

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::FunctionDescription::_InternalParse
          (FunctionDescription *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  string *psVar5;
  FeatureDescription *pFVar6;
  MessageLite *pMVar7;
  uint uVar8;
  char *field_name;
  undefined8 *puVar9;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar10;
  ArenaStringPtr *pAVar11;
  internal *this_00;
  char cVar12;
  uint res;
  RepeatedPtrFieldBase *this_01;
  pair<const_char_*,_unsigned_int> pVar13;
  StringPiece str;
  byte *local_60;
  InternalMetadata *local_58;
  RepeatedPtrFieldBase *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_60 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
  if (!bVar4) {
    this_01 = &(this->state_).super_RepeatedPtrFieldBase;
    local_58 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->predictedprobabilitiesname_;
    local_40 = &this->predictedfeaturename_;
    local_48 = &this->name_;
    local_50 = this_01;
    do {
      bVar1 = *local_60;
      res = (uint)bVar1;
      pbVar10 = local_60 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar10 * 0x80) - 0x80;
        if ((char)*pbVar10 < '\0') {
          pVar13 = google::protobuf::internal::ReadTagFallback((char *)local_60,res);
          pbVar10 = (byte *)pVar13.first;
          res = pVar13.second;
        }
        else {
          pbVar10 = local_60 + 2;
        }
      }
      uVar8 = (res >> 3) - 1;
      local_60 = pbVar10;
      if (5 < uVar8) {
switchD_002241a4_default:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar10 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar10;
        }
        if ((local_58->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(local_58);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((local_58->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_60 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_60,ctx);
        goto joined_r0x00224458;
      }
      field_name = (char *)((long)&switchD_002241a4::switchdataD_003a423c +
                           (long)(int)(&switchD_002241a4::switchdataD_003a423c)[uVar8]);
      cVar12 = (char)res;
      switch(res >> 3) {
      case 1:
        if (cVar12 != '\n') goto switchD_002241a4_default;
        puVar9 = (undefined8 *)(local_58->ptr_ & 0xfffffffffffffffc);
        pAVar11 = local_48;
        if ((local_58->ptr_ & 1U) != 0) {
          puVar9 = (undefined8 *)*puVar9;
        }
        goto LAB_002241f4;
      case 2:
        if (cVar12 != '\x12') goto switchD_002241a4_default;
        local_60 = pbVar10 + -1;
        do {
          local_60 = local_60 + 1;
          pRVar3 = (this->input_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0022435c:
            pFVar6 = google::protobuf::Arena::
                     CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                               ((this->input_).super_RepeatedPtrFieldBase.arena_);
            pMVar7 = (MessageLite *)
                     google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                               (&(this->input_).super_RepeatedPtrFieldBase,pFVar6);
          }
          else {
            iVar2 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) goto LAB_0022435c;
            (this->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pMVar7 = (MessageLite *)pRVar3->elements[iVar2];
          }
          local_60 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,pMVar7,(char *)local_60);
          if (local_60 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_60 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_60 == 0x12));
        break;
      case 3:
        if (cVar12 != '\x1a') goto switchD_002241a4_default;
        local_60 = pbVar10 + -1;
        do {
          local_60 = local_60 + 1;
          pRVar3 = (this->output_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_00224262:
            pFVar6 = google::protobuf::Arena::
                     CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                               ((this->output_).super_RepeatedPtrFieldBase.arena_);
            pMVar7 = (MessageLite *)
                     google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                               (&(this->output_).super_RepeatedPtrFieldBase,pFVar6);
          }
          else {
            iVar2 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) goto LAB_00224262;
            (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pMVar7 = (MessageLite *)pRVar3->elements[iVar2];
          }
          local_60 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,pMVar7,(char *)local_60);
          if (local_60 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_60 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_60 == 0x1a));
        break;
      case 4:
        if (cVar12 != '\"') goto switchD_002241a4_default;
        puVar9 = (undefined8 *)(local_58->ptr_ & 0xfffffffffffffffc);
        if ((local_58->ptr_ & 1U) != 0) {
          puVar9 = (undefined8 *)*puVar9;
        }
        psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_40,puVar9);
        local_60 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (psVar5,(char *)local_60,ctx);
        this_00 = (internal *)(psVar5->_M_dataplus)._M_p;
        size = psVar5->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        goto LAB_00224303;
      case 5:
        if (cVar12 != '*') goto switchD_002241a4_default;
        puVar9 = (undefined8 *)(local_58->ptr_ & 0xfffffffffffffffc);
        pAVar11 = local_38;
        if ((local_58->ptr_ & 1U) != 0) {
          puVar9 = (undefined8 *)*puVar9;
        }
LAB_002241f4:
        psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar11,puVar9);
        local_60 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (psVar5,(char *)local_60,ctx);
        this_00 = (internal *)(psVar5->_M_dataplus)._M_p;
        size = psVar5->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
LAB_00224303:
        str.length_ = 0;
        str.ptr_ = (char *)size;
        bVar4 = google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
        this_01 = local_50;
        if (!bVar4) {
          return (char *)0x0;
        }
joined_r0x00224458:
        if (local_60 == (byte *)0x0) {
          return (char *)0x0;
        }
        break;
      case 6:
        if (cVar12 != '2') goto switchD_002241a4_default;
        local_60 = pbVar10 + -1;
        do {
          local_60 = local_60 + 1;
          pRVar3 = (this->state_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_002243d4:
            pFVar6 = google::protobuf::Arena::
                     CreateMaybeMessage<CoreML::Specification::FeatureDescription>(this_01->arena_);
            pMVar7 = (MessageLite *)
                     google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                               (this_01,pFVar6);
          }
          else {
            iVar2 = (this->state_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) goto LAB_002243d4;
            (this->state_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pMVar7 = (MessageLite *)pRVar3->elements[iVar2];
          }
          local_60 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,pMVar7,(char *)local_60);
          if (local_60 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_60 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_60 == 0x32));
      }
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_60;
}

Assistant:

const char* FunctionDescription::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.FeatureDescription input = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_input(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.FeatureDescription output = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_output(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string predictedFeatureName = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          auto str = _internal_mutable_predictedfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string predictedProbabilitiesName = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          auto str = _internal_mutable_predictedprobabilitiesname();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.FeatureDescription state = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_state(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}